

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O2

var __thiscall cs_impl::runtime_cs_ext::await(runtime_cs_ext *this,var *func)

{
  bool bVar1;
  type_info *ptVar2;
  object_method *poVar3;
  initializer_list<cs_impl::any> __l;
  allocator_type local_79;
  any local_78;
  vector<cs_impl::any,_std::allocator<cs_impl::any>_> local_70;
  async_callable local_58;
  
  ptVar2 = any::type(func);
  bVar1 = std::type_info::operator==(ptVar2,(type_info *)&cs::callable::typeinfo);
  if (bVar1) {
    async_callable::async_callable(&local_58,func);
    fiber::await<cs_impl::runtime_cs_ext::async_callable>((async_callable *)this);
    async_callable::~async_callable(&local_58);
  }
  else {
    ptVar2 = any::type(func);
    bVar1 = std::type_info::operator==(ptVar2,(type_info *)&cs::object_method::typeinfo);
    if (bVar1) {
      poVar3 = any::const_val<cs::object_method>(func);
      local_78.mDat = (poVar3->object).mDat;
      if (local_78.mDat != (proxy *)0x0) {
        (local_78.mDat)->refcount = (local_78.mDat)->refcount + 1;
      }
      __l._M_len = 1;
      __l._M_array = &local_78;
      std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::vector(&local_70,__l,&local_79);
      async_callable::async_callable(&local_58,&poVar3->callable,&local_70);
      fiber::await<cs_impl::runtime_cs_ext::async_callable>((async_callable *)this);
      async_callable::~async_callable(&local_58);
      std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::~vector(&local_70);
      any::recycle(&local_78);
    }
    else {
      any::any<cs::pointer>((any *)this,(pointer *)&cs::null_pointer);
    }
  }
  return (var)(proxy *)this;
}

Assistant:

var await(const var &func)
		{
			if (func.type() == typeid(callable)) {
				return fiber::await(async_callable(func));
			}
			else if (func.type() == typeid(object_method)) {
				const auto &om = func.const_val<object_method>();
				return fiber::await(async_callable(om.callable, {om.object}));
			}
			return null_pointer;
		}